

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

bool __thiscall Json::Value::asBool(Value *this)

{
  byte bVar1;
  ostringstream oss;
  string local_1a0;
  ostringstream local_180 [376];
  
  switch(this->field_0x8) {
  case 0:
    bVar1 = 0;
    break;
  case 1:
  case 2:
    bVar1 = (this->value_).int_ != 0;
    break;
  case 3:
    bVar1 = -((this->value_).real_ != 0.0) & 1;
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_180);
    std::operator<<((ostream *)local_180,"Value is not convertible to bool.");
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1a0);
  case 5:
    bVar1 = (this->value_).bool_;
  }
  return (bool)bVar1;
}

Assistant:

bool Value::asBool() const {
  switch (type_) {
  case booleanValue:
    return value_.bool_;
  case nullValue:
    return false;
  case intValue:
    return value_.int_ ? true : false;
  case uintValue:
    return value_.uint_ ? true : false;
  case realValue:
    // This is kind of strange. Not recommended.
    return (value_.real_ != 0.0) ? true : false;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to bool.");
}